

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.h
# Opt level: O1

int __thiscall Abstract<8U>::rename(Abstract<8U> *this,char *__old,char *__new)

{
  char *pcVar1;
  int iVar2;
  char *__s;
  
  __s = (char *)operator_new__(0x14);
  sprintf(__s,"WavingSketch<%d,%d>",(ulong)__old & 0xffffffff,(ulong)__new & 0xffffffff);
  pcVar1 = (char *)(this->name)._M_string_length;
  strlen(__s);
  iVar2 = std::__cxx11::string::_M_replace((ulong)&this->name,0,pcVar1,(ulong)__s);
  return iVar2;
}

Assistant:

void rename(int slot_num, int counter_num) {
		char* tp = new char[20];
		std::sprintf(tp, "WavingSketch<%d,%d>", slot_num, counter_num);
		name = tp;
	}